

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_iarchive_impl.cpp
# Opt level: O2

void __thiscall boost::archive::json_iarchive_impl::load_data(json_iarchive_impl *this)

{
  json_archive *this_00;
  primitive_iterator_t *__return_storage_ptr__;
  bool bVar1;
  int iVar2;
  Json *this_01;
  reference this_02;
  key_type *__str;
  mapped_type *this_03;
  reference pvVar3;
  undefined1 local_80 [8];
  iterator itr;
  
  this_00 = &(this->super_json_archive_interface).archive_;
  json_archive::push_class_repository(this_00);
  this_01 = json_archive::get_data_abi_cxx11_(this_00);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::begin((iterator *)local_80,this_01);
  __return_storage_ptr__ = &itr.m_it.primitive_iterator;
  while( true ) {
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::end((iterator *)__return_storage_ptr__,this_01);
    bVar1 = nlohmann::detail::
            iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
            ::operator!=((iterator *)local_80,
                         (iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                          *)__return_storage_ptr__);
    if (!bVar1) break;
    this_02 = nlohmann::detail::
              iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
              ::operator*((iterator *)local_80);
    __str = nlohmann::detail::
            iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
            ::key((iterator *)local_80);
    itr.m_it.primitive_iterator.m_it._0_4_ = std::__cxx11::stoi(__str,(size_t *)0x0,10);
    this_03 = std::__detail::
              _Map_base<unsigned_int,_std::pair<const_unsigned_int,_boost::archive::ClassInfo>,_std::allocator<std::pair<const_unsigned_int,_boost::archive::ClassInfo>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_boost::archive::ClassInfo>,_std::allocator<std::pair<const_unsigned_int,_boost::archive::ClassInfo>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)&(this->super_json_archive_interface).class_map_,
                           (key_type *)__return_storage_ptr__);
    pvVar3 = nlohmann::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             ::operator[](this_02,(key_type *)param::ClassNameType_abi_cxx11_);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::
    get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __return_storage_ptr__,pvVar3);
    std::__cxx11::string::operator=((string *)this_03,(string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
    pvVar3 = nlohmann::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             ::operator[](this_02,(key_type *)param::TrackingType_abi_cxx11_);
    iVar2 = nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::get<int,_int,_0>(pvVar3);
    this_03->track_ = iVar2;
    pvVar3 = nlohmann::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             ::operator[](this_02,(key_type *)param::VersionType_abi_cxx11_);
    iVar2 = nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::get<int,_int,_0>(pvVar3);
    this_03->version_ = iVar2;
    nlohmann::detail::
    iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
    ::operator++((iterator *)local_80);
  }
  json_archive::pop_data(this_00);
  return;
}

Assistant:

void json_iarchive_impl::load_data()
{
    archive_.push_class_repository();
    Json& data = archive_.get_data();
    for(auto itr = data.begin(); itr != data.end(); itr++)
    {
        auto& value = *itr;
        ClassInfo& dst = class_map_[std::stoi(itr.key())];
        dst.name_ = value[param::ClassNameType];
        dst.track_ = value[param::TrackingType];
        dst.version_ = value[param::VersionType];
    }
    archive_.pop_data();
}